

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec_asn1.cc
# Opt level: O3

int eckey_pub_encode(CBB *out,EVP_PKEY *key)

{
  EC_KEY *key_00;
  int iVar1;
  EC_GROUP *group;
  EC_POINT *point;
  CBB key_bitstring;
  CBB algorithm;
  CBB spki;
  CBB CStack_a8;
  CBB local_78;
  CBB local_48;
  
  key_00 = (EC_KEY *)key->pkey;
  group = (EC_GROUP *)EC_KEY_get0_group(key_00);
  point = (EC_POINT *)EC_KEY_get0_public_key(key_00);
  iVar1 = CBB_add_asn1(out,&local_48,0x20000010);
  if (((((iVar1 != 0) && (iVar1 = CBB_add_asn1(&local_48,&local_78,0x20000010), iVar1 != 0)) &&
       (iVar1 = CBB_add_asn1_element(&local_78,6,ec_asn1_meth.oid,7), iVar1 != 0)) &&
      ((iVar1 = EC_KEY_marshal_curve_name(&local_78,group), iVar1 != 0 &&
       (iVar1 = CBB_add_asn1(&local_48,&CStack_a8,3), iVar1 != 0)))) &&
     ((iVar1 = CBB_add_u8(&CStack_a8,'\0'), iVar1 != 0 &&
      ((iVar1 = EC_POINT_point2cbb(&CStack_a8,group,point,POINT_CONVERSION_UNCOMPRESSED,
                                   (BN_CTX *)0x0), iVar1 != 0 &&
       (iVar1 = CBB_flush(out), iVar1 != 0)))))) {
    return 1;
  }
  ERR_put_error(6,0,0x69,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec_asn1.cc"
                ,0x2c);
  return 0;
}

Assistant:

static int eckey_pub_encode(CBB *out, const EVP_PKEY *key) {
  const EC_KEY *ec_key = reinterpret_cast<const EC_KEY *>(key->pkey);
  const EC_GROUP *group = EC_KEY_get0_group(ec_key);
  const EC_POINT *public_key = EC_KEY_get0_public_key(ec_key);

  // See RFC 5480, section 2.
  CBB spki, algorithm, key_bitstring;
  if (!CBB_add_asn1(out, &spki, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1(&spki, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&algorithm, CBS_ASN1_OBJECT, ec_asn1_meth.oid,
                            ec_asn1_meth.oid_len) ||
      !EC_KEY_marshal_curve_name(&algorithm, group) ||
      !CBB_add_asn1(&spki, &key_bitstring, CBS_ASN1_BITSTRING) ||
      !CBB_add_u8(&key_bitstring, 0 /* padding */) ||
      !EC_POINT_point2cbb(&key_bitstring, group, public_key,
                          POINT_CONVERSION_UNCOMPRESSED, NULL) ||
      !CBB_flush(out)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_ENCODE_ERROR);
    return 0;
  }

  return 1;
}